

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O1

void __thiscall QToolButtonPrivate::onMenuTriggered(QToolButtonPrivate *this,QAction *action)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long in_RCX;
  long lVar4;
  long in_FS_OFFSET;
  QAction *local_20;
  void *local_18;
  QAction **ppQStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (action == (QAction *)0x0) goto LAB_004c3ba1;
  lVar2 = (this->actionsCopy).d.size;
  if (lVar2 == 0) {
LAB_004c3b60:
    in_RCX = -1;
  }
  else {
    lVar4 = -8;
    do {
      lVar1 = lVar2 * -8 + lVar4;
      if (lVar1 == -8) goto LAB_004c3b5a;
      in_RCX = lVar4 + 8;
      lVar3 = lVar4 + 8;
      lVar4 = in_RCX;
    } while (*(QAction **)((long)(this->actionsCopy).d.ptr + lVar3) != action);
    in_RCX = in_RCX >> 3;
LAB_004c3b5a:
    if (lVar1 == -8) goto LAB_004c3b60;
  }
  if (in_RCX == -1) {
    ppQStack_10 = &local_20;
    local_18 = (void *)0x0;
    local_20 = action;
    QMetaObject::activate
              (*(QObject **)&(this->super_QAbstractButtonPrivate).super_QWidgetPrivate.field_0x8,
               &QToolButton::staticMetaObject,0,&local_18);
  }
LAB_004c3ba1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolButtonPrivate::onMenuTriggered(QAction *action)
{
    Q_Q(QToolButton);
    if (action && !actionsCopy.contains(action))
        emit q->triggered(action);
}